

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

char * Abc_SopFromTruthBin(char *pTruth)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  Vec_Int_t *p;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  
  sVar3 = strlen(pTruth);
  uVar2 = (uint)sVar3;
  uVar8 = uVar2;
  uVar1 = Abc_Base2Log(uVar2);
  if (1 << ((byte)uVar1 & 0x1f) == uVar2) {
    p = Vec_IntAlloc(uVar8);
    uVar6 = 0;
    uVar10 = 0;
    uVar8 = uVar2;
    if (0 < (int)uVar2) {
      uVar10 = sVar3 & 0xffffffff;
    }
    for (; uVar10 != uVar6; uVar6 = uVar6 + 1) {
      if ((pTruth[uVar6] & 0xfeU) != 0x30) {
        Vec_IntFree(p);
        printf("String %s does not look like a binary representation of the truth table.\n",pTruth);
        return (char *)0x0;
      }
      if (pTruth[uVar6] == 0x31) {
        Vec_IntPush(p,uVar8 - 1);
      }
      uVar8 = uVar8 - 1;
    }
    uVar8 = p->nSize;
    if (uVar8 == 0 || uVar8 == uVar2) {
      Vec_IntFree(p);
      puts("Cannot create constant function.");
      pcVar4 = (char *)0x0;
    }
    else {
      iVar9 = uVar1 + 3;
      pcVar4 = (char *)malloc((long)(int)(uVar8 * iVar9 + 1));
      pcVar4[(int)(uVar8 * iVar9)] = '\0';
      uVar10 = 0;
      uVar6 = 0;
      if (0 < (int)uVar1) {
        uVar6 = (ulong)uVar1;
      }
      pcVar12 = pcVar4;
      uVar11 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar11 = uVar10;
      }
      for (; uVar10 != uVar11; uVar10 = uVar10 + 1) {
        uVar2 = Vec_IntEntry(p,(int)uVar10);
        lVar5 = uVar10 * (long)iVar9;
        uVar8 = uVar1;
        for (uVar7 = 0; uVar8 = uVar8 - 1, uVar6 != uVar7; uVar7 = uVar7 + 1) {
          pcVar12[uVar7] = (uVar2 >> (uVar8 & 0x1f) & 1) == 0 ^ 0x31;
        }
        (pcVar4 + (int)uVar1 + lVar5)[0] = ' ';
        (pcVar4 + (int)uVar1 + lVar5)[1] = '1';
        pcVar4[(long)(int)uVar1 + lVar5 + 2] = '\n';
        pcVar12 = pcVar12 + iVar9;
      }
      Vec_IntFree(p);
    }
  }
  else {
    pcVar4 = (char *)0x0;
    printf("String %s does not look like a truth table of a %d-variable function.\n",pTruth,
           (ulong)uVar1);
  }
  return pcVar4;
}

Assistant:

char * Abc_SopFromTruthBin( char * pTruth )
{
    char * pSopCover, * pCube;
    int nTruthSize, nVars, Digit, Length, Mint, i, b;
    Vec_Int_t * vMints;

    // get the number of variables
    nTruthSize = strlen(pTruth);
    nVars = Abc_Base2Log( nTruthSize );
    if ( nTruthSize != (1 << (nVars)) )
    {
        printf( "String %s does not look like a truth table of a %d-variable function.\n", pTruth, nVars );
        return NULL;
    }

    // collect the on-set minterms
    vMints = Vec_IntAlloc( 100 );
    for ( i = 0; i < nTruthSize; i++ )
    {
        if ( pTruth[i] >= '0' && pTruth[i] <= '1' )
            Digit = pTruth[i] - '0';
        else
        {
            Vec_IntFree( vMints );
            printf( "String %s does not look like a binary representation of the truth table.\n", pTruth );
            return NULL;
        }
        if ( Digit == 1 )
            Vec_IntPush( vMints, nTruthSize - 1 - i );
    }
    if ( Vec_IntSize( vMints ) == 0 || Vec_IntSize( vMints ) == nTruthSize )
    {
        Vec_IntFree( vMints );
        printf( "Cannot create constant function.\n" );
        return NULL;
    }

    // create the SOP representation of the minterms
    Length = Vec_IntSize(vMints) * (nVars + 3);
    pSopCover = ABC_ALLOC( char, Length + 1 );
    pSopCover[Length] = 0;
    Vec_IntForEachEntry( vMints, Mint, i )
    {
        pCube = pSopCover + i * (nVars + 3);
        for ( b = 0; b < nVars; b++ )
            if ( Mint & (1 << (nVars-1-b)) )
//            if ( Mint & (1 << b) )
                pCube[b] = '1';
            else
                pCube[b] = '0';
        pCube[nVars + 0] = ' ';
        pCube[nVars + 1] = '1';
        pCube[nVars + 2] = '\n';
    }
    Vec_IntFree( vMints );
    return pSopCover;
}